

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

bool __thiscall QMakeEvaluator::prepareProject(QMakeEvaluator *this,QString *inDir)

{
  QMakeGlobals *pQVar1;
  qsizetype qVar2;
  QArrayDataPointer<char16_t> *pQVar3;
  QArrayDataPointer<char16_t> *pQVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  QString *pQVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  QArrayDataPointer<char16_t> *pQVar11;
  long in_FS_OFFSET;
  QFileInfo qdfi_1;
  QFileInfo qsdfi;
  QFileInfo qdfi;
  QArrayDataPointer<char16_t> *pQStack_f0;
  QArrayDataPointer<char16_t> *local_e8;
  QFileInfo qdfi_2;
  QArrayDataPointer<char16_t> *pQStack_d0;
  QArrayDataPointer<char16_t> *local_c8;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  pQVar1 = this->m_option;
  if (pQVar1->do_cache == true) {
    local_78.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_98.d = (pQVar1->cachefile).d.d;
    local_98.ptr = (pQVar1->cachefile).d.ptr;
    local_98.size = (pQVar1->cachefile).d.size;
    if ((QArrayDataPointer<char16_t> *)local_98.d != (QArrayDataPointer<char16_t> *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QArrayDataPointer<char16_t> *)local_98.d)->d)->d =
           *(int *)&((DataPointer *)&((QArrayDataPointer<char16_t> *)local_98.d)->d)->d + 1;
      UNLOCK();
    }
    if ((QArrayDataPointer<char16_t> *)local_98.size == (QArrayDataPointer<char16_t> *)0x0) {
      if ((this->m_outputDir).d.size != 0) {
        QString::operator=((QString *)&local_58,(QString *)&this->m_outputDir);
        do {
          local_b8.size = -0x5555555555555556;
          local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          QLatin1String::QLatin1String((QLatin1String *)&qdfi,"/.qmake.super");
          pQVar11 = _qdfi;
          _qdfi_2 = &local_58;
          QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                    ((QString *)&local_b8,(QStringBuilder<QString_&,_QLatin1String> *)&qdfi_2);
          bVar9 = QMakeVfs::exists(this->m_vfs,(QString *)&local_b8,(VfsFlags)0x0);
          if (bVar9) {
            QDir::cleanPath((QString *)&qdfi_2);
            pQVar7 = (QString *)(this->m_superfile).d.d;
            (this->m_superfile).d.d = (Data *)_qdfi_2;
            (this->m_superfile).d.ptr = (char16_t *)pQVar11;
            (this->m_superfile).d.size = (qsizetype)pQStack_f0;
            _qdfi_2 = (QArrayDataPointer<char16_t> *)pQVar7;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qdfi_2);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            break;
          }
          _qdfi = (QArrayDataPointer<char16_t> *)0xaaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo(&qdfi,(QString *)&local_58);
          cVar10 = QFileInfo::isRoot();
          if (cVar10 == '\0') {
            QFileInfo::path();
            pDVar5 = local_58.d;
            local_58.d = (Data *)_qdfi_2;
            local_58.ptr = (char16_t *)pQVar11;
            _qdfi_2 = (QArrayDataPointer<char16_t> *)pDVar5;
            local_58.size = (qsizetype)pQStack_f0;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qdfi_2);
          }
          else {
            QString::clear((QString *)&local_58);
          }
          QFileInfo::~QFileInfo(&qdfi);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        } while (cVar10 == '\0');
        local_b8.d = (inDir->d).d;
        local_b8.ptr = (inDir->d).ptr;
        local_b8.size = (inDir->d).size;
        if ((QArrayDataPointer<char16_t> *)local_b8.d != (QArrayDataPointer<char16_t> *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QArrayDataPointer<char16_t> *)local_b8.d)->d)->d =
               *(int *)&((DataPointer *)&((QArrayDataPointer<char16_t> *)local_b8.d)->d)->d + 1;
          UNLOCK();
        }
        _qdfi_2 = (QArrayDataPointer<char16_t> *)(this->m_outputDir).d.d;
        pQStack_d0 = (QArrayDataPointer<char16_t> *)(this->m_outputDir).d.ptr;
        local_c8 = (QArrayDataPointer<char16_t> *)(this->m_outputDir).d.size;
        if (_qdfi_2 != (QArrayDataPointer<char16_t> *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&_qdfi_2->d)->d = *(int *)&((DataPointer *)&_qdfi_2->d)->d + 1;
          UNLOCK();
        }
        do {
          pQVar3 = local_c8;
          pQVar11 = pQStack_d0;
          QLatin1String::QLatin1String((QLatin1String *)&qdfi_1,"/.qmake.conf");
          _qsdfi = &local_b8;
          QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                    ((QString *)&qdfi,(QStringBuilder<QString_&,_QLatin1String> *)&qsdfi);
          qVar2 = local_78.size;
          pcVar6 = local_78.ptr;
          pDVar5 = local_78.d;
          local_78.d = (Data *)_qdfi;
          local_78.ptr = (char16_t *)pQStack_f0;
          _qdfi = (QArrayDataPointer<char16_t> *)pDVar5;
          local_78.size = (qsizetype)local_e8;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qdfi);
          bVar9 = QMakeVfs::exists(this->m_vfs,(QString *)&local_78,(VfsFlags)0x0);
          if (!bVar9) {
            QString::clear((QString *)&local_78);
          }
          QLatin1String::QLatin1String((QLatin1String *)&qdfi_1,"/.qmake.cache");
          _qsdfi = (QArrayDataPointer<char16_t> *)&qdfi_2;
          QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                    ((QString *)&qdfi,(QStringBuilder<QString_&,_QLatin1String> *)&qsdfi);
          local_e8 = (QArrayDataPointer<char16_t> *)local_98.size;
          pQStack_f0 = (QArrayDataPointer<char16_t> *)local_98.ptr;
          pDVar5 = local_98.d;
          local_98.d = (Data *)_qdfi;
          local_98.ptr = pcVar6;
          _qdfi = (QArrayDataPointer<char16_t> *)pDVar5;
          local_98.size = qVar2;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qdfi);
          bVar9 = QMakeVfs::exists(this->m_vfs,(QString *)&local_98,(VfsFlags)0x0);
          if (!bVar9) {
            QString::clear((QString *)&local_98);
          }
          if (((QArrayDataPointer<char16_t> *)local_78.size != (QArrayDataPointer<char16_t> *)0x0)
             || ((QArrayDataPointer<char16_t> *)local_98.size != (QArrayDataPointer<char16_t> *)0x0)
             ) {
            bVar9 = operator!=((QString *)&qdfi_2,(QString *)&local_b8);
            if (bVar9) {
              QString::operator=(&this->m_sourceRoot,(QString *)&local_b8);
            }
            QString::operator=(&this->m_buildRoot,(QString *)&qdfi_2);
            bVar9 = false;
            break;
          }
          bVar9 = comparesEqual((QString *)&qdfi_2,(QString *)&local_58);
          if (bVar9) {
            bVar9 = true;
            break;
          }
          _qsdfi = (QArrayDataPointer<char16_t> *)0xaaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo(&qsdfi,(QString *)&local_b8);
          _qdfi_1 = -0x5555555555555556;
          QFileInfo::QFileInfo(&qdfi_1,(QString *)&qdfi_2);
          cVar10 = QFileInfo::isRoot();
          if (cVar10 == '\0') {
            cVar10 = QFileInfo::isRoot();
            bVar8 = false;
            bVar9 = true;
            if (cVar10 == '\0') {
              QFileInfo::path();
              local_c8 = (QArrayDataPointer<char16_t> *)local_b8.size;
              pQStack_d0 = (QArrayDataPointer<char16_t> *)local_b8.ptr;
              pDVar5 = local_b8.d;
              local_b8.d = (Data *)_qdfi;
              local_b8.ptr = (char16_t *)pQStack_f0;
              _qdfi = (QArrayDataPointer<char16_t> *)pDVar5;
              local_b8.size = (qsizetype)local_e8;
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qdfi);
              QFileInfo::path();
              pQVar4 = _qdfi_2;
              _qdfi_2 = _qdfi;
              _qdfi = pQVar4;
              pQStack_f0 = pQVar11;
              local_e8 = pQVar3;
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qdfi);
              bVar8 = true;
              bVar9 = false;
            }
          }
          else {
            bVar8 = false;
            bVar9 = true;
          }
          QFileInfo::~QFileInfo(&qdfi_1);
          QFileInfo::~QFileInfo(&qsdfi);
        } while (bVar8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&qdfi_2);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        if (bVar9) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          if (!bVar9) goto LAB_001f988e;
          goto LAB_001f9693;
        }
        goto LAB_001f95d3;
      }
    }
    else {
      QFileInfo::QFileInfo(&qdfi_2,(QString *)&local_98);
      QFileInfo::path();
      pQVar3 = (QArrayDataPointer<char16_t> *)(this->m_buildRoot).d.d;
      pQVar4 = (QArrayDataPointer<char16_t> *)(this->m_buildRoot).d.ptr;
      (this->m_buildRoot).d.d = local_b8.d;
      (this->m_buildRoot).d.ptr = local_b8.ptr;
      pQVar11 = (QArrayDataPointer<char16_t> *)(this->m_buildRoot).d.size;
      (this->m_buildRoot).d.size = local_b8.size;
      local_b8.d = (Data *)pQVar3;
      local_b8.ptr = (char16_t *)pQVar4;
      local_b8.size = (qsizetype)pQVar11;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QFileInfo::~QFileInfo(&qdfi_2);
LAB_001f95d3:
      QDir::cleanPath((QString *)&local_b8);
      pDVar5 = (this->m_conffile).d.d;
      pcVar6 = (this->m_conffile).d.ptr;
      (this->m_conffile).d.d = local_b8.d;
      (this->m_conffile).d.ptr = local_b8.ptr;
      qVar2 = (this->m_conffile).d.size;
      (this->m_conffile).d.size = local_b8.size;
      local_b8.d = pDVar5;
      local_b8.ptr = pcVar6;
      local_b8.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QDir::cleanPath((QString *)&local_b8);
      pQVar3 = (QArrayDataPointer<char16_t> *)(this->m_cachefile).d.d;
      pQVar4 = (QArrayDataPointer<char16_t> *)(this->m_cachefile).d.ptr;
      (this->m_cachefile).d.d = local_b8.d;
      (this->m_cachefile).d.ptr = local_b8.ptr;
      pQVar11 = (QArrayDataPointer<char16_t> *)(this->m_cachefile).d.size;
      (this->m_cachefile).d.size = local_b8.size;
      local_b8.d = (Data *)pQVar3;
      local_b8.ptr = (char16_t *)pQVar4;
      local_b8.size = (qsizetype)pQVar11;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
LAB_001f9693:
  local_78.d = (this->m_outputDir).d.d;
  local_78.ptr = (this->m_outputDir).d.ptr;
  local_78.size = (this->m_outputDir).d.size;
  if ((QArrayDataPointer<char16_t> *)local_78.d != (QArrayDataPointer<char16_t> *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QArrayDataPointer<char16_t> *)local_78.d)->d)->d =
         *(int *)&((DataPointer *)&((QArrayDataPointer<char16_t> *)local_78.d)->d)->d + 1;
    UNLOCK();
  }
  while( true ) {
    local_98.size = -0x5555555555555556;
    local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String((QLatin1String *)&qdfi_2,"/.qmake.stash");
    local_b8.ptr = (char16_t *)_qdfi_2;
    local_b8.size = (qsizetype)pQStack_d0;
    local_b8.d = (Data *)&local_78;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_98,(QStringBuilder<QString_&,_QLatin1String> *)&local_b8);
    pQVar11 = &local_58;
    if ((QArrayDataPointer<char16_t> *)local_58.size == (QArrayDataPointer<char16_t> *)0x0) {
      pQVar11 = &(this->m_buildRoot).d;
    }
    bVar9 = comparesEqual((QString *)&local_78,(QString *)pQVar11);
    if ((bVar9) || (bVar9 = QMakeVfs::exists(this->m_vfs,(QString *)&local_98,(VfsFlags)0x0), bVar9)
       ) {
      QDir::cleanPath((QString *)&local_b8);
      pQVar3 = (QArrayDataPointer<char16_t> *)(this->m_stashfile).d.d;
      pQVar4 = (QArrayDataPointer<char16_t> *)(this->m_stashfile).d.ptr;
      (this->m_stashfile).d.d = local_b8.d;
      (this->m_stashfile).d.ptr = local_b8.ptr;
      pQVar11 = (QArrayDataPointer<char16_t> *)(this->m_stashfile).d.size;
      (this->m_stashfile).d.size = local_b8.size;
      local_b8.d = (Data *)pQVar3;
      local_b8.ptr = (char16_t *)pQVar4;
      local_b8.size = (qsizetype)pQVar11;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      goto LAB_001f987c;
    }
    _qdfi_2 = (QArrayDataPointer<char16_t> *)0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&qdfi_2,(QString *)&local_78);
    cVar10 = QFileInfo::isRoot();
    if (cVar10 != '\0') break;
    QFileInfo::path();
    qVar2 = local_78.size;
    pcVar6 = local_78.ptr;
    pDVar5 = local_78.d;
    local_78.d = local_b8.d;
    local_78.ptr = local_b8.ptr;
    local_b8.d = pDVar5;
    local_b8.ptr = pcVar6;
    local_78.size = local_b8.size;
    local_b8.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QFileInfo::~QFileInfo(&qdfi_2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  QFileInfo::~QFileInfo(&qdfi_2);
LAB_001f987c:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
LAB_001f988e:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QMakeEvaluator::prepareProject(const QString &inDir)
{
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    QString superdir;
    if (m_option->do_cache) {
        QString conffile;
        QString cachefile = m_option->cachefile;
        if (cachefile.isEmpty())  { //find it as it has not been specified
            if (m_outputDir.isEmpty())
                goto no_cache;
            superdir = m_outputDir;
            forever {
                QString superfile = superdir + QLatin1String("/.qmake.super");
                if (m_vfs->exists(superfile, flags)) {
                    m_superfile = QDir::cleanPath(superfile);
                    break;
                }
                QFileInfo qdfi(superdir);
                if (qdfi.isRoot()) {
                    superdir.clear();
                    break;
                }
                superdir = qdfi.path();
            }
            QString sdir = inDir;
            QString dir = m_outputDir;
            forever {
                conffile = sdir + QLatin1String("/.qmake.conf");
                if (!m_vfs->exists(conffile, flags))
                    conffile.clear();
                cachefile = dir + QLatin1String("/.qmake.cache");
                if (!m_vfs->exists(cachefile, flags))
                    cachefile.clear();
                if (!conffile.isEmpty() || !cachefile.isEmpty()) {
                    if (dir != sdir)
                        m_sourceRoot = sdir;
                    m_buildRoot = dir;
                    break;
                }
                if (dir == superdir)
                    goto no_cache;
                QFileInfo qsdfi(sdir);
                QFileInfo qdfi(dir);
                if (qsdfi.isRoot() || qdfi.isRoot())
                    goto no_cache;
                sdir = qsdfi.path();
                dir = qdfi.path();
            }
        }